

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwizard.cpp
# Opt level: O0

void __thiscall QWizardPrivate::_q_handleFieldObjectDestroyed(QWizardPrivate *this,QObject *object)

{
  const_iterator pos;
  bool bVar1;
  iterator o;
  QWizardField *pQVar2;
  int *piVar3;
  QObject *in_RSI;
  QList<QWizardField> *in_RDI;
  long in_FS_OFFSET;
  int index;
  QWizardField *field;
  int destroyed_index;
  QString field_name;
  iterator it2;
  iterator it;
  QList<QWizardField> *in_stack_ffffffffffffff58;
  iterator in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff70;
  int in_stack_ffffffffffffff74;
  undefined4 in_stack_ffffffffffffff88;
  int iVar4;
  const_iterator local_28;
  QWizardField *local_20;
  undefined4 local_14;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = -1;
  local_10.i = (QWizardField *)&DAT_aaaaaaaaaaaaaaaa;
  local_10 = QList<QWizardField>::begin(in_RDI);
  while( true ) {
    o = QList<QWizardField>::end(in_RDI);
    bVar1 = QList<QWizardField>::iterator::operator!=(&local_10,o);
    if (!bVar1) break;
    pQVar2 = QList<QWizardField>::iterator::operator*(&local_10);
    if (pQVar2->object == in_RSI) {
      local_14 = 0xffffffff;
      iVar4 = QMap<QString,_int>::value
                        ((QMap<QString,_int> *)
                         CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                         (QString *)in_stack_ffffffffffffff68._M_node,(int *)in_RDI);
      QMap<QString,_int>::remove((QMap<QString,_int> *)(in_RDI + 0x20),(char *)&pQVar2->name);
      in_stack_ffffffffffffff58 = in_RDI + 0x1f;
      QList<QWizardField>::const_iterator::const_iterator(&local_28,local_10);
      pos.i._4_4_ = iVar4;
      pos.i._0_4_ = in_stack_ffffffffffffff88;
      local_20 = (QWizardField *)
                 QList<QWizardField>::erase
                           ((QList<QWizardField> *)
                            CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),pos);
      local_10 = (iterator)local_20;
    }
    else {
      QList<QWizardField>::iterator::operator++(&local_10);
    }
  }
  if (iVar4 != -1) {
    QMap<QString,_int>::begin
              ((QMap<QString,_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    while( true ) {
      QMap<QString,_int>::end
                ((QMap<QString,_int> *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                );
      bVar1 = ::operator!=((iterator *)in_RDI,(iterator *)in_stack_ffffffffffffff58);
      if (!bVar1) break;
      piVar3 = QMap<QString,_int>::iterator::value((iterator *)0x7ba11c);
      in_stack_ffffffffffffff74 = *piVar3;
      if (iVar4 < in_stack_ffffffffffffff74) {
        QMap<QString,_int>::iterator::key((iterator *)0x7ba15a);
        QString::QString((QString *)in_RDI,(QString *)in_stack_ffffffffffffff58);
        in_stack_ffffffffffffff68._M_node =
             (_Base_ptr)
             QMap<QString,_int>::insert
                       ((QMap<QString,_int> *)
                        CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                        in_stack_ffffffffffffff68._M_node,(int *)in_RDI);
        QString::~QString((QString *)0x7ba19c);
      }
      QMap<QString,_int>::iterator::operator++((iterator *)in_RDI);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWizardPrivate::_q_handleFieldObjectDestroyed(QObject *object)
{
    int destroyed_index = -1;
    QList<QWizardField>::iterator it = fields.begin();
    while (it != fields.end()) {
        const QWizardField &field = *it;
        if (field.object == object) {
            destroyed_index = fieldIndexMap.value(field.name, -1);
            fieldIndexMap.remove(field.name);
            it = fields.erase(it);
        } else {
            ++it;
        }
    }
    if (destroyed_index != -1) {
        QMap<QString, int>::iterator it2 = fieldIndexMap.begin();
        while (it2 != fieldIndexMap.end()) {
            int index = it2.value();
            if (index > destroyed_index) {
                QString field_name = it2.key();
                fieldIndexMap.insert(field_name, index-1);
            }
            ++it2;
        }
    }
}